

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetChildrenCount
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this)

{
  int iVar1;
  uint32 uVar2;
  JavascriptWeakSet *this_00;
  ArenaAllocator *alloc;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  JavascriptWeakSet *data;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this_local;
  
  this_00 = VarTo<Js::JavascriptWeakSet>(this->instance);
  iVar1 = JavascriptWeakSet::Size(this_00);
  if ((0 < iVar1) &&
     (this->propertyList ==
      (List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    alloc = GetArenaFromContext(this->scriptContext);
    pLVar3 = JsUtil::
             List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    this->propertyList = pLVar3;
    GetChildren(this);
  }
  uVar2 = JavascriptWeakSet::Size(this_00);
  return uVar2;
}

Assistant:

uint32 RecyclableCollectionObjectWalker<TData>::GetChildrenCount()
    {
        TData* data = VarTo<TData>(instance);
        if (data->Size() > 0 && propertyList == nullptr)
        {
            propertyList = JsUtil::List<RecyclableCollectionObjectWalkerPropertyData<TData>, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            GetChildren();
        }

        return data->Size();
    }